

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::UpdateForces(ChBody *this,double mytime)

{
  pointer psVar1;
  ChSystem *pCVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  shared_ptr<chrono::ChForce> *force;
  pointer psVar6;
  ChVector<double> v;
  ChVector<double> mtorque;
  ChVector<double> mforce;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  dVar3 = (this->Force_acc).m_data[1];
  dVar4 = (this->Force_acc).m_data[2];
  dVar5 = (this->Torque_acc).m_data[0];
  (this->Xforce).m_data[0] = (this->Force_acc).m_data[0];
  (this->Xforce).m_data[1] = dVar3;
  (this->Xforce).m_data[2] = dVar4;
  (this->Xtorque).m_data[0] = dVar5;
  dVar3 = (this->Torque_acc).m_data[2];
  (this->Xtorque).m_data[1] = (this->Torque_acc).m_data[1];
  (this->Xtorque).m_data[2] = dVar3;
  local_48.m_data[2] = 0.0;
  local_68.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  psVar1 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->forcelist).
                super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    ChForce::Update((psVar6->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    ,mytime);
    ChForce::GetBodyForceTorque
              ((psVar6->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &local_48,&local_68);
    ChVector<double>::operator+=(&this->Xforce,&local_48);
    ChVector<double>::operator+=(&this->Xtorque,&local_68);
  }
  pCVar2 = (this->super_ChPhysicsItem).system;
  if (pCVar2 != (ChSystem *)0x0) {
    local_88.m_data[2] = (this->variables).mass;
    local_88.m_data[0] = local_88.m_data[2] * (pCVar2->G_acc).m_data[0];
    local_88.m_data[1] = local_88.m_data[2] * (pCVar2->G_acc).m_data[1];
    local_88.m_data[2] = local_88.m_data[2] * (pCVar2->G_acc).m_data[2];
    ChVector<double>::operator+=(&this->Xforce,&local_88);
  }
  return;
}

Assistant:

void ChBody::UpdateForces(double mytime) {
    // Initialize body force (in abs. coords) and torque (in local coords)
    // with current values from the accumulators.
    Xforce = Force_acc;
    Xtorque = Torque_acc;

    // Accumulate other applied forces
    ChVector<> mforce;
    ChVector<> mtorque;

    for (auto& force : forcelist) {
        // update positions, f=f(t,q)
        force->Update(mytime);

        force->GetBodyForceTorque(mforce, mtorque);
        Xforce += mforce;
        Xtorque += mtorque;
    }

    // Add gravitational forces
    if (system) {
        Xforce += system->Get_G_acc() * GetMass();
    }
}